

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O1

RecyclerTestObject * ScannedObject<51U,_1000U>::New(void)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  Recycler *this;
  RecyclerTestObject *pRVar5;
  type_info *__n;
  undefined4 *in_FS_OFFSET;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  uVar3 = PAL_rand();
  __n = (type_info *)(ulong)((uVar3 % 0x3b6) * 8 + 0x198);
  local_58 = (undefined1  [8])&ScannedObject<51u,1000u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_422e;
  data.filename._0_4_ = 0xb1;
  data.typeinfo = __n;
  this = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_58);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_001ba46d;
    *in_FS_OFFSET = 0;
  }
  pRVar5 = (RecyclerTestObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (this,(size_t)(__n + 0x18));
  if (pRVar5 == (RecyclerTestObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_001ba46d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  (pRVar5->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_00358058;
  pRVar5->generation = RecyclerTestObject::currentGeneration;
  (pRVar5->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_003582c0;
  *(uint *)&pRVar5[1].super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       uVar3 % 0x3b6 + 0x33;
  memset(&pRVar5[1].generation,0,(size_t)__n);
  return pRVar5;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewPlus(recyclerInstance, sizeof(RecyclerTestObject *) * count, ScannedObject, count);
    }